

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

char * mjs::op_text(token_type tt)

{
  char *pcVar1;
  runtime_error *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(tt) {
  case rshiftshiftequal:
    pcVar1 = ">>>=";
    break;
  case rshiftshift:
    pcVar1 = ">>>";
    break;
  case lshiftequal:
    pcVar1 = "<<=";
    break;
  case rshiftequal:
    pcVar1 = ">>=";
    break;
  case equalequalequal:
    pcVar1 = "===";
    break;
  case notequalequal:
    pcVar1 = "!==";
    break;
  case equalequal:
    pcVar1 = "==";
    break;
  case notequal:
    pcVar1 = "!=";
    break;
  case ltequal:
    pcVar1 = "<=";
    break;
  case gtequal:
    pcVar1 = ">=";
    break;
  case andand:
    pcVar1 = "&&";
    break;
  case oror:
    pcVar1 = "||";
    break;
  case plusplus:
    pcVar1 = "++";
    break;
  case minusminus:
    pcVar1 = "--";
    break;
  case lshift:
    pcVar1 = "<<";
    break;
  case rshift:
    pcVar1 = ">>";
    break;
  case plusequal:
    pcVar1 = "+=";
    break;
  case minusequal:
    pcVar1 = "-=";
    break;
  case multiplyequal:
    pcVar1 = "*=";
    break;
  case divideequal:
    pcVar1 = "/=";
    break;
  case andequal:
    pcVar1 = "&=";
    break;
  case orequal:
    pcVar1 = "|=";
    break;
  case xorequal:
    pcVar1 = "^=";
    break;
  case modequal:
    pcVar1 = "%=";
    break;
  case equal:
    pcVar1 = "=";
    break;
  case gt:
    pcVar1 = ">";
    break;
  case lt:
    pcVar1 = "<";
    break;
  case comma:
    pcVar1 = ",";
    break;
  case not_:
    pcVar1 = "!";
    break;
  case tilde:
    pcVar1 = "~";
    break;
  case question:
    pcVar1 = "?";
    break;
  case colon:
    pcVar1 = ":";
    break;
  case dot:
    pcVar1 = ".";
    break;
  case plus:
    pcVar1 = "+";
    break;
  case minus:
    pcVar1 = "-";
    break;
  case multiply:
    pcVar1 = "*";
    break;
  case divide:
    pcVar1 = "/";
    break;
  case and_:
    pcVar1 = "&";
    break;
  case or_:
    pcVar1 = "|";
    break;
  case xor_:
    pcVar1 = "^";
    break;
  case mod:
    pcVar1 = "%";
    break;
  case lparen:
    pcVar1 = "(";
    break;
  case rparen:
    pcVar1 = ")";
    break;
  case lbrace:
    pcVar1 = "{";
    break;
  case rbrace:
    pcVar1 = "}";
    break;
  case lbracket:
    pcVar1 = "[";
    break;
  case rbracket:
    pcVar1 = "]";
    break;
  case semicolon:
    pcVar1 = ";";
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_58,tt);
    std::operator+(&local_38,"Invalid token type in op_text: ",&sStack_58);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case in_:
    pcVar1 = " in ";
    break;
  case instanceof_:
    pcVar1 = " instanceof ";
  }
  return pcVar1;
}

Assistant:

const char* op_text(token_type tt) {
    switch (tt) {
#define CASE_PUNCTUATOR(name, str, ...) case token_type::name: return str;
        MJS_PUNCTUATORS(CASE_PUNCTUATOR)
#undef CASE_PUNCTUATOR
    case token_type::in_: return " in ";
    case token_type::instanceof_: return " instanceof ";
    default:
        throw std::runtime_error("Invalid token type in op_text: " + std::to_string((int)tt));
    }
}